

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O1

void scan_tree(deflate_state *s,ct_data *tree,int max_code)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  
  uVar1 = (tree->dl).dad;
  tree[(long)max_code + 1].dl.dad = 0xffff;
  if (-1 < max_code) {
    uVar8 = 7;
    if (uVar1 == 0) {
      uVar8 = 0x8a;
    }
    iVar7 = (uVar1 != 0) + 3;
    uVar5 = 0xffffffff;
    uVar4 = 0;
    uVar2 = (uint)uVar1;
    iVar10 = 0;
    do {
      uVar6 = (ulong)uVar2;
      uVar1 = tree[uVar4 + 1].dl.dad;
      uVar3 = (uint)uVar1;
      iVar9 = iVar10 + 1;
      if (((int)uVar8 <= iVar9) || (uVar2 != uVar3)) {
        if (iVar9 < iVar7) {
          s->bl_tree[uVar6].fc.freq = s->bl_tree[uVar6].fc.freq + (short)iVar9;
        }
        else if (uVar2 == 0) {
          if (iVar10 < 10) {
            s->bl_tree[0x11].fc.freq = s->bl_tree[0x11].fc.freq + 1;
          }
          else {
            s->bl_tree[0x12].fc.freq = s->bl_tree[0x12].fc.freq + 1;
          }
        }
        else {
          if (uVar2 != (uint)uVar5) {
            s->bl_tree[uVar6].fc.freq = s->bl_tree[uVar6].fc.freq + 1;
          }
          s->bl_tree[0x10].fc.freq = s->bl_tree[0x10].fc.freq + 1;
        }
        iVar9 = 0;
        uVar5 = uVar6;
        if (uVar1 == 0) {
          iVar7 = 3;
          uVar8 = 0x8a;
        }
        else {
          iVar7 = 4 - (uint)(uVar2 == uVar3);
          uVar8 = uVar2 == uVar3 ^ 7;
        }
      }
      uVar4 = uVar4 + 1;
      uVar2 = uVar3;
      iVar10 = iVar9;
    } while (max_code + 1 != uVar4);
  }
  return;
}

Assistant:

local void scan_tree (s, tree, max_code)
    deflate_state *s;
    ct_data *tree;   /* the tree to be scanned */
    int max_code;    /* and its largest code of non zero frequency */
{
    int n;                     /* iterates over all tree elements */
    int prevlen = -1;          /* last emitted length */
    int curlen;                /* length of current code */
    int nextlen = tree[0].Len; /* length of next code */
    int count = 0;             /* repeat count of the current code */
    int max_count = 7;         /* max repeat count */
    int min_count = 4;         /* min repeat count */

  if (nextlen == 0) {max_count = 138; min_count = 3;}
    tree[max_code+1].Len = (ush)0xffff; /* guard */

    for (n = 0; n <= max_code; n++) {
        curlen = nextlen; nextlen = tree[n+1].Len;
        if (++count < max_count && curlen == nextlen) {
            continue;
        } else if (count < min_count) {
            s->bl_tree[curlen].Freq += ((ush)count);
        } else if (curlen != 0) {
            if (curlen != prevlen) s->bl_tree[curlen].Freq++;
            s->bl_tree[REP_3_6].Freq++;
        } else if (count <= 10) {
            s->bl_tree[REPZ_3_10].Freq++;
        } else {
            s->bl_tree[REPZ_11_138].Freq++;
        }
        count = 0; prevlen = curlen;
        if (nextlen == 0) {
          max_count = 138; min_count = 3;
        } else if (curlen == nextlen) {
          max_count = 6; min_count = 3;
        } else {
          max_count = 7; min_count = 4;
        }
    }
}